

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vepu2_v2.c
# Opt level: O1

MPP_RET hal_jpege_vepu2_init(void *hal,MppEncHalCfg *cfg)

{
  RK_U32 RVar1;
  MPP_RET MVar2;
  void *pvVar3;
  MppClientType type;
  
  RVar1 = mpp_get_vcodec_type();
  mpp_env_get_u32("hal_jpege_debug",&hal_jpege_debug,0);
  if (((byte)hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu2","enter hal %p cfg %p\n","hal_jpege_vepu2_init",hal,cfg);
  }
  type = ((RVar1 >> 0x13 & 1) != 0) + VPU_CLIENT_VEPU2;
  cfg->type = type;
  MVar2 = mpp_dev_init(&cfg->dev,type);
  if (MVar2 == MPP_OK) {
    *(MppDev *)hal = cfg->dev;
    *(MppClientType *)((long)hal + 8) = cfg->type;
    *(RK_S32 *)((long)hal + 0x2c) = cfg->task_cnt;
    jpege_bits_init((JpegeBits *)((long)hal + 0x10));
    if ((*(long *)((long)hal + 0x10) == 0) &&
       (_mpp_log_l(2,"hal_jpege_vepu2","Assertion %s failed at %s:%d\n",(char *)0x0,"ctx->bits",
                   "hal_jpege_vepu2_init",0x57), (mpp_debug._3_1_ & 0x10) != 0)) {
      abort();
    }
    MVar2 = hal_jpege_vepu_init_rc((HalJpegeRc *)((long)hal + 0x130));
    if (MVar2 == MPP_OK) {
      *(MppEncCfgSet **)((long)hal + 0x38) = cfg->cfg;
      *(undefined4 *)((long)hal + 0x28) = 0x2e0;
      pvVar3 = mpp_osal_calloc("hal_jpege_vepu2_init",(long)*(int *)((long)hal + 0x2c) * 0x368);
      *(void **)((long)hal + 0x18) = pvVar3;
      if (pvVar3 != (void *)0x0) {
        pvVar3 = mpp_osal_calloc("hal_jpege_vepu2_init",
                                 (long)*(int *)((long)hal + 0x2c) *
                                 ((ulong)*(uint *)((long)hal + 0x28) + 0x88));
        *(void **)((long)hal + 0x20) = pvVar3;
        if (pvVar3 != (void *)0x0) {
          if (((byte)hal_jpege_debug & 1) == 0) {
            return MPP_OK;
          }
          _mpp_log_l(4,"hal_jpege_vepu2","leave hal %p\n","hal_jpege_vepu2_init",hal);
          return MPP_OK;
        }
      }
      _mpp_log_l(2,"hal_jpege_vepu2","failed to malloc vepu2 regs\n","hal_jpege_vepu2_init");
      MVar2 = MPP_NOK;
    }
  }
  else {
    _mpp_log_l(2,"hal_jpege_vepu2","mpp_dev_init failed. ret: %d\n","hal_jpege_vepu2_init",
               (ulong)(uint)MVar2);
  }
  return MVar2;
}

Assistant:

MPP_RET hal_jpege_vepu2_init(void *hal, MppEncHalCfg *cfg)
{
    MPP_RET ret = MPP_OK;
    HalJpegeCtx *ctx = (HalJpegeCtx *)hal;
    MppClientType type;
    RK_U32 vcodec_type = mpp_get_vcodec_type();

    mpp_env_get_u32("hal_jpege_debug", &hal_jpege_debug, 0);
    hal_jpege_dbg_func("enter hal %p cfg %p\n", hal, cfg);

    /* update output to MppEnc */
    type = (vcodec_type & HAVE_VEPU2_JPEG) ?
           VPU_CLIENT_VEPU2_JPEG : VPU_CLIENT_VEPU2;

    cfg->type = type;
    ret = mpp_dev_init(&cfg->dev, type);
    if (ret) {
        mpp_err_f("mpp_dev_init failed. ret: %d\n", ret);
        return ret;
    }
    ctx->dev = cfg->dev;
    ctx->type = cfg->type;
    ctx->task_cnt = cfg->task_cnt;

    jpege_bits_init(&ctx->bits);
    mpp_assert(ctx->bits);
    ret = hal_jpege_vepu_init_rc(&ctx->hal_rc);
    if (ret)
        return ret;

    ctx->cfg = cfg->cfg;
    ctx->reg_size = sizeof(RK_U32) * VEPU_JPEGE_VEPU2_NUM_REGS;
    ctx->regs = mpp_calloc_size(void, (ctx->reg_size + EXTRA_INFO_SIZE) * ctx->task_cnt);
    if (NULL == ctx->regs) {
        mpp_err_f("failed to malloc vepu2 regs\n");
        return MPP_NOK;
    }

    ctx->regs_out = mpp_calloc_size(void, (ctx->reg_size + EXTRA_INFO_SIZE) *  ctx->task_cnt);
    if (NULL == ctx->regs_out) {
        mpp_err_f("failed to malloc vepu2 regs\n");
        return MPP_NOK;
    }

    hal_jpege_dbg_func("leave hal %p\n", hal);
    return MPP_OK;
}